

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O0

string * __thiscall nivalis::anon_unknown_1::ParenRule::operator()(ParenRule *this,string *s)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  value_type vVar4;
  reference pvVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  bool bVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  string *in_stack_00000020;
  ParenRule *in_stack_00000028;
  size_t i;
  size_t right;
  size_t left;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  string tmp;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  size_type in_stack_ffffffffffffff08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  unsigned_long local_80;
  unsigned_long local_78;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    std::__cxx11::string::string((string *)in_RDI,local_18);
  }
  else {
    std::__cxx11::string::string(local_38,in_RSI);
    std::__cxx11::string::push_back((char)local_38);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::size();
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x27e9be);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x27e9e4);
    std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    vVar4 = std::__cxx11::string::size();
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_60,0);
    *pvVar5 = vVar4;
    local_70 = 0;
    local_78 = 0;
    local_80 = 1;
    while( true ) {
      uVar1 = local_80;
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= uVar1) break;
      if (local_78 < local_80) {
LAB_0027eb7c:
        local_70 = local_80;
        puVar6 = std::max<unsigned_long>(&local_80,&local_78);
        local_78 = *puVar6;
        while( true ) {
          uVar1 = local_78;
          uVar2 = std::__cxx11::string::size();
          bVar8 = false;
          if (uVar1 < uVar2) {
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
            in_stack_ffffffffffffff04 = (int)*pcVar7;
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
            bVar8 = in_stack_ffffffffffffff04 == *pcVar7;
          }
          if (!bVar8) break;
          local_78 = local_78 + 1;
        }
        vVar4 = local_78 - local_70;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_60,local_80);
        *pvVar5 = vVar4;
        local_78 = local_78 - 1;
      }
      else {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_60,local_80 - local_70);
        if ((local_78 - local_80) + 1 <= *pvVar5) goto LAB_0027eb7c;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_60,local_80 - local_70);
        vVar4 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_60,local_80);
        *pvVar5 = vVar4;
      }
      local_80 = local_80 + 1;
    }
    std::__cxx11::string::size();
    _replace(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             in_stack_00000008);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

std::string operator()(const std::string & s) const {
        if (s.size() < prefix.size()) return s;
        std::string tmp = prefix; tmp.push_back('\v'); tmp.append(s);
        std::vector<size_t> za(tmp.size());
        za.resize(tmp.size());
        za[0] = tmp.size();
        size_t left = 0, right = 0;
        for (size_t i = 1; i < tmp.size(); ++i) {
            if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
            else {
                left = i; right = std::max(i, right);
                while (right < tmp.size() && tmp[right] == tmp[right - left]) ++right;
                za[i] = right - left; --right;
            }
        }
        return _replace(s, 0, s.size(), za);
    }